

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmTable.c
# Opt level: O3

int Nm_ManTableDelete(Nm_Man_t *p,int ObjId)

{
  uint uVar1;
  Nm_Entry_t *pNVar2;
  Nm_Entry_t *pNVar3;
  Nm_Entry_t **ppNVar4;
  uint uVar5;
  int iVar6;
  Nm_Entry_t *pNVar7;
  Nm_Entry_t **ppNVar8;
  Nm_Entry_t *pNVar9;
  ulong uVar10;
  char cVar11;
  uint uVar12;
  Nm_Entry_t *pNVar13;
  
  p->nEntries = p->nEntries + -1;
  pNVar7 = Nm_ManTableLookupId(p,ObjId);
  if (pNVar7 == (Nm_Entry_t *)0x0) {
    __assert_fail("Nm_ManTableLookupId(p, ObjId) != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                  ,0x76,"int Nm_ManTableDelete(Nm_Man_t *, int)");
  }
  uVar1 = p->nBins;
  ppNVar4 = p->pBinsI2N +
            (ulong)(((uint)ObjId >> 0x18) * 0x161 ^ (ObjId & 0xffU) * 0x1f01 ^
                   ((uint)ObjId >> 0x10 & 0xff) * 0x38f ^ ((uint)ObjId >> 8 & 0xff) * 0xb9b) %
            (ulong)uVar1;
  do {
    ppNVar8 = ppNVar4;
    pNVar7 = *ppNVar8;
    ppNVar4 = &pNVar7->pNextI2N;
  } while (pNVar7->ObjId != ObjId);
  *ppNVar8 = pNVar7->pNextI2N;
  cVar11 = (char)pNVar7[1].Type;
  uVar5 = 0;
  if (cVar11 != '\0') {
    uVar10 = 1;
    uVar12 = 0;
    do {
      uVar5 = uVar5 ^ (int)cVar11 * (int)cVar11 *
                      (&Nm_HashString_s_Primes)[~((uVar12 / 10) * 10) + (int)uVar10];
      uVar12 = uVar12 + 1;
      cVar11 = *(char *)((long)&pNVar7[1].Type + uVar10);
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (cVar11 != '\0');
  }
  ppNVar4 = p->pBinsN2I + (ulong)uVar5 % (ulong)uVar1;
  do {
    ppNVar8 = ppNVar4;
    pNVar2 = *ppNVar8;
    if (pNVar2 == (Nm_Entry_t *)0x0) break;
    ppNVar4 = &pNVar2->pNextN2I;
  } while (pNVar2 != pNVar7);
  if (pNVar2 == (Nm_Entry_t *)0x0) {
    pNVar13 = pNVar7->pNameSake;
    if (pNVar13 == (Nm_Entry_t *)0x0) {
      __assert_fail("fRemoved",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                    ,0x8a,"int Nm_ManTableDelete(Nm_Man_t *, int)");
    }
  }
  else {
    if (pNVar2 != pNVar7) {
      __assert_fail("*ppSpot == pEntry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                    ,0x84,"int Nm_ManTableDelete(Nm_Man_t *, int)");
    }
    *ppNVar8 = pNVar2->pNextN2I;
    pNVar13 = pNVar7->pNameSake;
    if (pNVar13 == (Nm_Entry_t *)0x0) {
      return 1;
    }
  }
  pNVar3 = pNVar7;
  if (pNVar13 == pNVar7) {
    __assert_fail("pEntry->pNameSake != pEntry",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                  ,0x8e,"int Nm_ManTableDelete(Nm_Man_t *, int)");
  }
  do {
    pNVar9 = pNVar3;
    pNVar3 = pNVar9->pNameSake;
  } while (pNVar9->pNameSake != pNVar7);
  iVar6 = strcmp((char *)(pNVar9 + 1),(char *)(pNVar7 + 1));
  if (iVar6 == 0) {
    pNVar7 = (Nm_Entry_t *)0x0;
    if (pNVar13 != pNVar9) {
      pNVar7 = pNVar13;
    }
    pNVar9->pNameSake = pNVar7;
    if (pNVar2 != (Nm_Entry_t *)0x0) {
      if (pNVar9->pNextN2I != (Nm_Entry_t *)0x0) {
        __assert_fail("pPrev->pNextN2I == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                      ,0x99,"int Nm_ManTableDelete(Nm_Man_t *, int)");
      }
      pNVar9->pNextN2I = *ppNVar8;
      *ppNVar8 = pNVar9;
    }
    return 1;
  }
  __assert_fail("!strcmp(pPrev->Name, pEntry->Name)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                ,0x90,"int Nm_ManTableDelete(Nm_Man_t *, int)");
}

Assistant:

int Nm_ManTableDelete( Nm_Man_t * p, int ObjId )
{
    Nm_Entry_t ** ppSpot, * pEntry, * pPrev;
    int fRemoved;
    p->nEntries--;
    // remove the entry from the table Id->Name
    assert( Nm_ManTableLookupId(p, ObjId) != NULL );
    ppSpot = p->pBinsI2N + Nm_HashNumber(ObjId, p->nBins);
    while ( (*ppSpot)->ObjId != (unsigned)ObjId )
        ppSpot = &(*ppSpot)->pNextI2N;
    pEntry = *ppSpot; 
    *ppSpot = (*ppSpot)->pNextI2N;
    // remove the entry from the table Name->Id
    ppSpot = p->pBinsN2I + Nm_HashString(pEntry->Name, p->nBins);
    while ( *ppSpot && *ppSpot != pEntry )
        ppSpot = &(*ppSpot)->pNextN2I;
    // remember if we found this one in the list
    fRemoved = (*ppSpot != NULL);
    if ( *ppSpot )
    {
        assert( *ppSpot == pEntry );
        *ppSpot = (*ppSpot)->pNextN2I;
    }
    // quit if this entry has no namesakes
    if ( pEntry->pNameSake == NULL )
    {
        assert( fRemoved );
        return 1;
    }
    // remove entry from the ring of namesakes
    assert( pEntry->pNameSake != pEntry );
    for ( pPrev = pEntry; pPrev->pNameSake != pEntry; pPrev = pPrev->pNameSake );
    assert( !strcmp(pPrev->Name, pEntry->Name) );
    assert( pPrev->pNameSake == pEntry );
    if ( pEntry->pNameSake == pPrev ) // two entries in the ring
        pPrev->pNameSake = NULL;
    else
        pPrev->pNameSake = pEntry->pNameSake;
    // reinsert the ring back if we removed its connection with the list in the table
    if ( fRemoved )
    {
        assert( pPrev->pNextN2I == NULL );
        pPrev->pNextN2I = *ppSpot;
        *ppSpot = pPrev;
    }
    return 1;
}